

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

symtbl_t * find_scope_id(symtbl_t *s,int scope_id)

{
  uint uVar1;
  symtbl_t *psVar2;
  ulong uVar3;
  
  psVar2 = s;
  if (s->scope_id != scope_id) {
    uVar1 = s->num_children;
    uVar3 = 0;
    do {
      if (uVar1 == uVar3) {
        return (symtbl_t *)0x0;
      }
      psVar2 = s->children[uVar3];
      if (psVar2->scope_id == scope_id) {
        return psVar2;
      }
      psVar2 = find_scope_id(psVar2,scope_id);
      uVar3 = uVar3 + 1;
    } while (psVar2 == (symtbl_t *)0x0);
  }
  return psVar2;
}

Assistant:

symtbl_t* find_scope_id(symtbl_t* s, int scope_id)
{
    unsigned int i;
    symtbl_t* ret;
    if (s->scope_id == scope_id)
        return s;

    for (i = 0; i < s->num_children; i++)
    {
        if (s->children[i]->scope_id == scope_id)
            return s->children[i];

        ret = find_scope_id(s->children[i], scope_id);
        if (ret)
            return ret;
    }
    return NULL;
}